

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip.c
# Opt level: O3

int zip_archive_extract(mz_zip_archive *zip_archive,char *dir,
                       _func_int_char_ptr_void_ptr *on_extract,void *arg)

{
  char *pcVar1;
  char *__src;
  uint uVar2;
  mz_bool mVar3;
  int iVar4;
  ulong uVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  long lVar12;
  size_t __n;
  mz_uint file_index;
  int iVar13;
  bool bVar14;
  mz_zip_archive_file_stat info;
  char symlink_to [513];
  undefined8 local_ab0;
  char local_aa8 [512];
  undefined1 local_8a8;
  mz_zip_archive_file_stat local_8a0;
  char local_448 [528];
  char local_238 [520];
  
  local_8a8 = 0;
  local_ab0 = on_extract;
  memset(local_448,0,0x201);
  uVar5 = strlen(dir);
  iVar4 = -2;
  if (uVar5 + 1 < 0x201) {
    memset(&local_8a0,0,0x458);
    strncpy(local_aa8,dir,0x200);
    cVar11 = local_aa8[uVar5 - 1];
    if ((cVar11 != '/') && (cVar11 != '\\')) {
      local_aa8[uVar5] = '/';
      uVar5 = uVar5 + 1;
    }
    __n = 0x200 - uVar5;
    if (0x1ff < __n) {
      __n = 0x200;
    }
    iVar13 = 0;
    if ((zip_archive != (mz_zip_archive *)0x0) &&
       (uVar2 = zip_archive->m_total_files, iVar13 = 0, uVar2 != 0)) {
      file_index = 0;
      mVar3 = mz_zip_reader_file_stat(zip_archive,0,&local_8a0);
      if (mVar3 != 0) {
        __src = local_8a0.m_filename;
LAB_0011042b:
        pcVar7 = __src;
        cVar11 = local_8a0.m_filename[0];
        if (local_8a0.m_filename[0] != '\0') {
          while ((cVar11 == '/' || (cVar11 == '\\'))) {
            pcVar1 = pcVar7 + 1;
            pcVar7 = pcVar7 + 1;
            cVar11 = *pcVar1;
          }
          lVar8 = 0;
          lVar9 = 0;
          do {
            if ((cVar11 == '/') || (cVar11 == '\\')) {
              if (lVar9 != 0) {
                lVar12 = 0;
                do {
                  if (__src[lVar12 + lVar8] != '.') {
                    lVar12 = lVar9 + lVar8;
                    lVar8 = lVar8 + lVar9 + 1;
                    local_8a0.m_filename[lVar12] = cVar11;
                    break;
                  }
                  lVar12 = lVar12 + 1;
                } while (lVar9 != lVar12);
              }
              lVar9 = 0;
            }
            else {
              if (cVar11 == '\0') goto LAB_001104b4;
              __src[lVar9 + lVar8] = cVar11;
              lVar9 = lVar9 + 1;
            }
            pcVar7 = pcVar7 + 1;
            cVar11 = *pcVar7;
          } while( true );
        }
        iVar13 = -2;
        goto LAB_001106c9;
      }
LAB_00110691:
      iVar13 = -3;
    }
LAB_001106c9:
    mVar3 = mz_zip_reader_end_internal(zip_archive,1);
    iVar4 = -0x19;
    if (mVar3 != 0) {
      iVar4 = iVar13;
    }
  }
  return iVar4;
LAB_001104b4:
  pcVar7 = __src + lVar8;
  if (lVar9 != 0) {
    lVar8 = 0;
    do {
      if (pcVar7[lVar8] != '.') {
        pcVar7 = pcVar7 + lVar9;
        break;
      }
      lVar8 = lVar8 + 1;
    } while (lVar9 != lVar8);
  }
  *pcVar7 = '\0';
  strncpy(local_aa8 + uVar5,__src,__n);
  memset(local_238,0,0x201);
  if (local_aa8[0] != '\0') {
    uVar10 = 0;
    cVar11 = local_aa8[0];
    do {
      if (((cVar11 == '\\') || (cVar11 == '/')) && (uVar10 != 0)) {
        if (cVar11 == '\\') {
          local_aa8[uVar10] = '/';
        }
        iVar4 = mkdir(local_238,0x1ed);
        if ((iVar4 == -1) && (piVar6 = __errno_location(), *piVar6 != 0x11)) {
          iVar13 = -0x17;
          goto LAB_001106c9;
        }
      }
      cVar11 = local_aa8[uVar10 + 1];
      local_238[uVar10] = local_aa8[uVar10];
    } while ((cVar11 != '\0') && (bVar14 = uVar10 < 0x1ff, uVar10 = uVar10 + 1, bVar14));
  }
  if (((local_8a0.m_version_made_by._1_1_ | 0x10) == 0x13) &&
     ((local_8a0.m_external_attr & 0x20000000) != 0)) {
    iVar13 = -0x12;
    if ((0x200 < local_8a0.m_uncomp_size) ||
       (mVar3 = mz_zip_reader_extract_to_mem_no_alloc1
                          (zip_archive,file_index,local_448,0x200,0,(void *)0x0,0,
                           (mz_zip_archive_file_stat *)0x0), mVar3 == 0)) goto LAB_001106c9;
    local_448[local_8a0.m_uncomp_size] = '\0';
    iVar4 = symlink(local_448,local_aa8);
    if (iVar4 != 0) {
      iVar13 = -0x18;
      goto LAB_001106c9;
    }
  }
  else {
    mVar3 = mz_zip_reader_is_file_a_directory(zip_archive,file_index);
    if ((mVar3 == 0) &&
       (mVar3 = mz_zip_reader_extract_to_file(zip_archive,file_index,local_aa8,0), mVar3 == 0)) {
      iVar13 = -0x13;
      goto LAB_001106c9;
    }
    if ((0xffff < local_8a0.m_external_attr) &&
       (iVar4 = chmod(local_aa8,local_8a0.m_external_attr >> 0x10), iVar4 < 0)) {
      iVar13 = -0x14;
      goto LAB_001106c9;
    }
  }
  if (local_ab0 == (_func_int_char_ptr_void_ptr *)0x0) {
    if (uVar2 <= file_index + 1) {
      iVar13 = 0;
      goto LAB_001106c9;
    }
  }
  else {
    iVar4 = (*local_ab0)(local_aa8,arg);
    iVar13 = 0;
    if ((iVar4 < 0) || (iVar13 = 0, uVar2 <= file_index + 1)) goto LAB_001106c9;
  }
  file_index = file_index + 1;
  mVar3 = mz_zip_reader_file_stat(zip_archive,file_index,&local_8a0);
  if (mVar3 == 0) goto LAB_00110691;
  goto LAB_0011042b;
}

Assistant:

static int zip_archive_extract(mz_zip_archive *zip_archive, const char *dir,
                               int (*on_extract)(const char *filename,
                                                 void *arg),
                               void *arg) {
  int err = 0;
  mz_uint i, n;
  char path[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  char symlink_to[MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE + 1];
  mz_zip_archive_file_stat info;
  size_t dirlen = 0, filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE;
  mz_uint32 xattr = 0;

  memset(path, 0, sizeof(path));
  memset(symlink_to, 0, sizeof(symlink_to));

  dirlen = strlen(dir);
  if (dirlen + 1 > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE) {
    return ZIP_EINVENTNAME;
  }

  memset((void *)&info, 0, sizeof(mz_zip_archive_file_stat));

#if defined(_MSC_VER)
  strcpy_s(path, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, dir);
#else
  strncpy(path, dir, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE);
#endif

  if (!ISSLASH(path[dirlen - 1])) {
#if defined(_WIN32) || defined(__WIN32__)
    path[dirlen] = '\\';
#else
    path[dirlen] = '/';
#endif
    ++dirlen;
  }

  if (filename_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen) {
    filename_size = MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE - dirlen;
  }
  // Get and print information about each file in the archive.
  n = mz_zip_reader_get_num_files(zip_archive);
  for (i = 0; i < n; ++i) {
    if (!mz_zip_reader_file_stat(zip_archive, i, &info)) {
      // Cannot get information about zip archive;
      err = ZIP_ENOENT;
      goto out;
    }

    if (!zip_name_normalize(info.m_filename, info.m_filename,
                            strlen(info.m_filename))) {
      // Cannot normalize file name;
      err = ZIP_EINVENTNAME;
      goto out;
    }

#if defined(_MSC_VER)
    strncpy_s(&path[dirlen], filename_size, info.m_filename, filename_size);
#else
    strncpy(&path[dirlen], info.m_filename, filename_size);
#endif
    err = zip_mkpath(path);
    if (err < 0) {
      // Cannot make a path
      goto out;
    }

    if ((((info.m_version_made_by >> 8) == 3) ||
         ((info.m_version_made_by >> 8) ==
          19)) // if zip is produced on Unix or macOS (3 and 19 from
               // section 4.4.2.2 of zip standard)
        && info.m_external_attr &
               (0x20 << 24)) { // and has sym link attribute (0x80 is file,
                               // 0x40 is directory)
#if defined(_WIN32) || defined(__WIN32__) || defined(_MSC_VER) ||              \
    defined(__MINGW32__)
#else
      if (info.m_uncomp_size > MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE ||
          !mz_zip_reader_extract_to_mem_no_alloc(
              zip_archive, i, symlink_to, MZ_ZIP_MAX_ARCHIVE_FILENAME_SIZE, 0,
              NULL, 0)) {
        err = ZIP_EMEMNOALLOC;
        goto out;
      }
      symlink_to[info.m_uncomp_size] = '\0';
      if (symlink(symlink_to, path) != 0) {
        err = ZIP_ESYMLINK;
        goto out;
      }
#endif
    } else {
      if (!mz_zip_reader_is_file_a_directory(zip_archive, i)) {
        if (!mz_zip_reader_extract_to_file(zip_archive, i, path, 0)) {
          // Cannot extract zip archive to file
          err = ZIP_ENOFILE;
          goto out;
        }
      }

#if defined(_MSC_VER) || defined(PS4)
      (void)xattr; // unused
#else
      xattr = (info.m_external_attr >> 16) & 0xFFFF;
      if (xattr > 0 && xattr <= MZ_UINT16_MAX) {
        if (CHMOD(path, (mode_t)xattr) < 0) {
          err = ZIP_ENOPERM;
          goto out;
        }
      }
#endif
    }

    if (on_extract) {
      if (on_extract(path, arg) < 0) {
        goto out;
      }
    }
  }

out:
  // Close the archive, freeing any resources it was using
  if (!mz_zip_reader_end(zip_archive)) {
    // Cannot end zip reader
    err = ZIP_ECLSZIP;
  }
  return err;
}